

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * chaiscript::json::JSON::json_escape(string *__return_storage_ptr__,string *str)

{
  char __c;
  bool bVar1;
  reference pcVar2;
  const_iterator cStack_38;
  char i;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *str_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = Catch::clara::std::__cxx11::
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin(str);
  cStack_38 = Catch::clara::std::__cxx11::
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(str);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end2,&stack0xffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    __c = *pcVar2;
    if (__c == '\b') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,"\\b");
    }
    else if (__c == '\t') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,"\\t");
    }
    else if (__c == '\n') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,"\\n");
    }
    else if (__c == '\f') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,"\\f");
    }
    else if (__c == '\r') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,"\\r");
    }
    else if (__c == '\"') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,"\\\"");
    }
    else if (__c == '\\') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,"\\\\");
    }
    else {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::operator+=(__return_storage_ptr__,__c);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string json_escape(const std::string &str) {
      std::string output;
      for (char i : str) {
        switch (i) {
          case '\"':
            output += "\\\"";
            break;
          case '\\':
            output += "\\\\";
            break;
          case '\b':
            output += "\\b";
            break;
          case '\f':
            output += "\\f";
            break;
          case '\n':
            output += "\\n";
            break;
          case '\r':
            output += "\\r";
            break;
          case '\t':
            output += "\\t";
            break;
          default:
            output += i;
            break;
        }
      }
      return output;
    }